

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O2

string * perf::format_code_position
                   (string *__return_storage_ptr__,string *file,size_t line,string *function)

{
  ostream *poVar1;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  stringstream strm;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&strm);
  poVar1 = std::operator<<(local_1a8,'#');
  __id._M_thread = pthread_self();
  pbVar2 = std::operator<<(poVar1,__id);
  poVar1 = std::operator<<(pbVar2,':');
  poVar1 = std::operator<<(poVar1,(string *)file);
  std::operator<<(poVar1,':');
  if (function->_M_string_length != 0) {
    poVar1 = std::operator<<(local_1a8,(string *)function);
    std::operator<<(poVar1,':');
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  return __return_storage_ptr__;
}

Assistant:

std::string format_code_position(const std::string &file, std::size_t line, const std::string &function = "")
    {
        std::stringstream strm;
        strm << '#' << std::this_thread::get_id() << ':' << file << ':';
        if (!function.empty())
            strm << function << ':';
        strm << line;
        return strm.str();
    }